

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints.cc
# Opt level: O2

bool __thiscall bssl::NameConstraints::IsPermittedIP(NameConstraints *this,Input ip)

{
  pointer ppVar1;
  Input addr1;
  Input addr1_00;
  Input mask;
  Input mask_00;
  Input addr2;
  Input addr2_00;
  bool bVar2;
  uchar *in_RAX;
  size_t unaff_RBX;
  uchar *unaff_R12;
  pair<bssl::der::Input,_bssl::der::Input> *excluded_ip;
  pointer ppVar3;
  size_t unaff_R13;
  uchar *unaff_R14;
  size_t unaff_R15;
  bool bVar4;
  
  ppVar3 = (this->excluded_subtrees_).ip_address_ranges.
           super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->excluded_subtrees_).ip_address_ranges.
           super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppVar3 == ppVar1) {
      if (((this->permitted_subtrees_).present_name_types & 0x80) == 0) {
        return true;
      }
      ppVar3 = (this->permitted_subtrees_).ip_address_ranges.
               super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (this->permitted_subtrees_).ip_address_ranges.
               super__Vector_base<std::pair<bssl::der::Input,_bssl::der::Input>,_std::allocator<std::pair<bssl::der::Input,_bssl::der::Input>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      do {
        bVar4 = ppVar3 == ppVar1;
        bVar2 = !bVar4;
        if (bVar4) {
          return bVar2;
        }
        addr1_00.data_.size_ = unaff_RBX;
        addr1_00.data_.data_ = in_RAX;
        addr2_00.data_.size_ = unaff_R15;
        addr2_00.data_.data_ = unaff_R14;
        mask_00.data_.size_ = unaff_R13;
        mask_00.data_.data_ = unaff_R12;
        bVar4 = IPAddressMatchesWithNetmask(addr1_00,addr2_00,mask_00);
        ppVar3 = ppVar3 + 1;
      } while (!bVar4);
      return bVar2;
    }
    addr1.data_.size_ = unaff_RBX;
    addr1.data_.data_ = in_RAX;
    addr2.data_.size_ = unaff_R15;
    addr2.data_.data_ = unaff_R14;
    mask.data_.size_ = unaff_R13;
    mask.data_.data_ = unaff_R12;
    bVar2 = IPAddressMatchesWithNetmask(addr1,addr2,mask);
    ppVar3 = ppVar3 + 1;
  } while (!bVar2);
  return false;
}

Assistant:

bool NameConstraints::IsPermittedIP(der::Input ip) const {
  for (const auto &excluded_ip : excluded_subtrees_.ip_address_ranges) {
    if (IPAddressMatchesWithNetmask(ip, excluded_ip.first,
                                    excluded_ip.second)) {
      return false;
    }
  }

  // If permitted subtrees are not constrained, any name that is not excluded is
  // allowed.
  if (!(permitted_subtrees_.present_name_types & GENERAL_NAME_IP_ADDRESS)) {
    return true;
  }

  for (const auto &permitted_ip : permitted_subtrees_.ip_address_ranges) {
    if (IPAddressMatchesWithNetmask(ip, permitted_ip.first,
                                    permitted_ip.second)) {
      return true;
    }
  }

  return false;
}